

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::MemPoolAccept
          (MemPoolAccept *this,CTxMemPool *mempool,Chainstate *active_chainstate)

{
  CTxMemPool *mempoolIn;
  _func_int **in_RDX;
  _func_int **in_RSI;
  CCoinsView *in_RDI;
  long in_FS_OFFSET;
  SubPackageState *in_stack_ffffffffffffffa8;
  Chainstate *in_stack_ffffffffffffffc8;
  CCoinsView *in_stack_ffffffffffffffd0;
  CCoinsViewMemPool *in_stack_ffffffffffffffd8;
  CCoinsViewCache *this_00;
  
  this_00 = *(CCoinsViewCache **)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_CCoinsView = in_RSI;
  CCoinsViewCache::CCoinsViewCache(this_00,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  mempoolIn = (CTxMemPool *)Chainstate::CoinsTip(in_stack_ffffffffffffffc8);
  CCoinsViewMemPool::CCoinsViewMemPool
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,mempoolIn);
  CCoinsView::CCoinsView((CCoinsView *)in_stack_ffffffffffffffa8);
  in_RDI[0x50]._vptr_CCoinsView = in_RDX;
  SubPackageState::SubPackageState(in_stack_ffffffffffffffa8);
  if (*(CCoinsViewCache **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MemPoolAccept(CTxMemPool& mempool, Chainstate& active_chainstate) :
        m_pool(mempool),
        m_view(&m_dummy),
        m_viewmempool(&active_chainstate.CoinsTip(), m_pool),
        m_active_chainstate(active_chainstate)
    {
    }